

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_ands_arm
               (TCGContext_conflict *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,TCGv_i64 c,
               uint32_t oprsz,uint32_t maxsz)

{
  TCGTemp *ts;
  
  ts = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  gen_dup_i64(tcg_ctx,vece,(TCGv_i64)((long)ts - (long)tcg_ctx),c);
  tcg_gen_gvec_2s_arm(tcg_ctx,dofs,aofs,oprsz,maxsz,(TCGv_i64)((long)ts - (long)tcg_ctx),&gop_ands);
  tcg_temp_free_internal_arm(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_gvec_ands(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       TCGv_i64 c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    gen_dup_i64(tcg_ctx, vece, tmp, c);
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_ands);
    tcg_temp_free_i64(tcg_ctx, tmp);
}